

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O3

vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
* __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::within
          (vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
           *__return_storage_ptr__,KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,
          Vector2<long> *high)

{
  pointer *pppVar1;
  anon_union_8_2_94730018_for_Vector2<long>_1 *paVar2;
  iterator __position;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  out_of_range *this_00;
  long lVar7;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_a8;
  anon_union_8_2_94730018_for_Vector2<long>_1 aStack_a0;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_98;
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  local_88;
  
  if (this->root == (Node *)0x0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"no such item");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_M_initialize_map(&local_88,0);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)&local_88,&this->root);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ::std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base(&local_88);
      return __return_storage_ptr__;
    }
    paVar2 = (anon_union_8_2_94730018_for_Vector2<long>_1 *)
             *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    lVar7 = 0;
    bVar5 = true;
    do {
      bVar6 = bVar5;
      if ((paVar2[lVar7].x < (&low->field_0)[lVar7].x) ||
         ((&high->field_0)[lVar7].x <= paVar2[lVar7].x)) goto LAB_00107af2;
      lVar7 = 1;
      bVar5 = false;
    } while (bVar6);
    local_a8 = *paVar2;
    aStack_a0 = paVar2[1];
    local_98 = paVar2[6];
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
      ::_M_realloc_insert<std::pair<phosg::Vector2<long>,long>>
                ((vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
                  *)__return_storage_ptr__,__position,(pair<phosg::Vector2<long>,_long> *)&local_a8)
      ;
    }
    else {
      (__position._M_current)->second = (long)local_98;
      ((__position._M_current)->first).field_0.x = (long)local_a8;
      ((__position._M_current)->first).field_1 =
           (anon_union_8_2_94730038_for_Vector2<long>_3)aStack_a0;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
LAB_00107af2:
    lVar7 = paVar2[2].x;
    lVar3 = paVar2[lVar7].x;
    lVar4 = (&high->field_0)[lVar7].x;
    if (((&low->field_0)[lVar7].x < lVar3) && (paVar2[3].x != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&local_88,(Node **)(paVar2 + 3));
    }
    if ((lVar3 <= lVar4) && (paVar2[4].x != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&local_88,(Node **)(paVar2 + 4));
    }
  } while( true );
}

Assistant:

typename std::vector<std::pair<CoordType, ValueType>>
KDTree<CoordType, ValueType>::within(
    const CoordType& low, const CoordType& high) const {
  if (this->root == nullptr) {
    throw std::out_of_range("no such item");
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  std::vector<std::pair<CoordType, ValueType>> ret;
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        ret.emplace_back(std::make_pair(n->pt, n->value));
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return ret;
}